

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::QuadMvIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint uVar3;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar4;
  BVH *bvh;
  size_t sVar5;
  Geometry *pGVar6;
  RTCFilterFunctionN p_Var7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  undefined8 uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  byte bVar21;
  int iVar22;
  byte bVar23;
  byte bVar24;
  ulong uVar25;
  long lVar26;
  NodeRef root;
  size_t sVar27;
  NodeRef *pNVar28;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar29;
  undefined4 uVar30;
  byte bVar31;
  ulong uVar32;
  bool bVar33;
  ulong uVar34;
  byte bVar35;
  ulong uVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 in_ZMM2 [64];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  float fVar93;
  float fVar98;
  undefined1 auVar94 [16];
  float fVar96;
  float fVar97;
  undefined1 auVar95 [64];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [64];
  undefined1 auVar104 [64];
  undefined1 auVar105 [64];
  undefined1 auVar106 [64];
  undefined1 auVar107 [64];
  undefined1 auVar108 [64];
  undefined1 auVar109 [64];
  undefined1 auVar110 [64];
  Precalculations pre;
  undefined1 local_1958 [16];
  RayK<4> *local_1948;
  RayK<4> *local_1940;
  ulong local_1938;
  RTCFilterFunctionNArguments args;
  RTCHitN local_18c8 [16];
  undefined1 local_18b8 [16];
  undefined1 local_18a8 [16];
  undefined1 local_1898 [16];
  undefined1 local_1888 [16];
  undefined1 local_1878 [16];
  undefined1 local_1868 [16];
  uint local_1858;
  uint uStack_1854;
  uint uStack_1850;
  uint uStack_184c;
  uint uStack_1848;
  uint uStack_1844;
  uint uStack_1840;
  uint uStack_183c;
  TravRayK<4,_true> tray;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  bvh = (BVH *)This->ptr;
  if ((bvh->root).ptr != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      occludedCoherent(valid_i,This,ray,context);
      return;
    }
    auVar37 = vpcmpeqd_avx(in_ZMM2._0_16_,in_ZMM2._0_16_);
    auVar42 = ZEXT816(0) << 0x40;
    uVar11 = vcmpps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),auVar42,5);
    uVar36 = vpcmpeqd_avx512vl(auVar37,(undefined1  [16])valid_i->field_0);
    uVar36 = ((byte)uVar11 & 0xf) & uVar36;
    bVar35 = (byte)uVar36;
    if (bVar35 != 0) {
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar37 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar105 = ZEXT1664(auVar37);
      auVar38 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.x.field_0,auVar37);
      auVar39 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      auVar106 = ZEXT1664(auVar39);
      uVar25 = vcmpps_avx512vl(auVar38,auVar39,1);
      auVar38 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar107 = ZEXT1664(auVar38);
      auVar40 = vdivps_avx512vl(auVar38,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar41 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.y.field_0,auVar37);
      uVar32 = vcmpps_avx512vl(auVar41,auVar39,1);
      auVar41 = vdivps_avx512vl(auVar38,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar37 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar37);
      uVar34 = vcmpps_avx512vl(auVar37,auVar39,1);
      auVar37 = vdivps_avx512vl(auVar38,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      bVar33 = (bool)((byte)uVar25 & 1);
      tray.rdir.field_0._0_4_ = (uint)bVar33 * 0x5d5e0b6b | (uint)!bVar33 * auVar40._0_4_;
      bVar33 = (bool)((byte)(uVar25 >> 1) & 1);
      tray.rdir.field_0._4_4_ = (uint)bVar33 * 0x5d5e0b6b | (uint)!bVar33 * auVar40._4_4_;
      bVar33 = (bool)((byte)(uVar25 >> 2) & 1);
      tray.rdir.field_0._8_4_ = (uint)bVar33 * 0x5d5e0b6b | (uint)!bVar33 * auVar40._8_4_;
      bVar33 = (bool)((byte)(uVar25 >> 3) & 1);
      tray.rdir.field_0._12_4_ = (uint)bVar33 * 0x5d5e0b6b | (uint)!bVar33 * auVar40._12_4_;
      bVar33 = (bool)((byte)uVar32 & 1);
      tray.rdir.field_0._16_4_ = (uint)bVar33 * 0x5d5e0b6b | (uint)!bVar33 * auVar41._0_4_;
      bVar33 = (bool)((byte)(uVar32 >> 1) & 1);
      tray.rdir.field_0._20_4_ = (uint)bVar33 * 0x5d5e0b6b | (uint)!bVar33 * auVar41._4_4_;
      bVar33 = (bool)((byte)(uVar32 >> 2) & 1);
      tray.rdir.field_0._24_4_ = (uint)bVar33 * 0x5d5e0b6b | (uint)!bVar33 * auVar41._8_4_;
      bVar33 = (bool)((byte)(uVar32 >> 3) & 1);
      tray.rdir.field_0._28_4_ = (uint)bVar33 * 0x5d5e0b6b | (uint)!bVar33 * auVar41._12_4_;
      bVar33 = (bool)((byte)uVar34 & 1);
      tray.rdir.field_0._32_4_ = (uint)bVar33 * 0x5d5e0b6b | (uint)!bVar33 * auVar37._0_4_;
      bVar33 = (bool)((byte)(uVar34 >> 1) & 1);
      tray.rdir.field_0._36_4_ = (uint)bVar33 * 0x5d5e0b6b | (uint)!bVar33 * auVar37._4_4_;
      bVar33 = (bool)((byte)(uVar34 >> 2) & 1);
      tray.rdir.field_0._40_4_ = (uint)bVar33 * 0x5d5e0b6b | (uint)!bVar33 * auVar37._8_4_;
      bVar33 = (bool)((byte)(uVar34 >> 3) & 1);
      tray.rdir.field_0._44_4_ = (uint)bVar33 * 0x5d5e0b6b | (uint)!bVar33 * auVar37._12_4_;
      uVar25 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar42,1);
      auVar37 = vpbroadcastd_avx512vl(ZEXT416(0x10));
      tray.nearXYZ.field_0._0_4_ = (uint)((byte)uVar25 & 1) * auVar37._0_4_;
      tray.nearXYZ.field_0._4_4_ = (uint)((byte)(uVar25 >> 1) & 1) * auVar37._4_4_;
      tray.nearXYZ.field_0._8_4_ = (uint)((byte)(uVar25 >> 2) & 1) * auVar37._8_4_;
      tray.nearXYZ.field_0._12_4_ = (uint)((byte)(uVar25 >> 3) & 1) * auVar37._12_4_;
      uVar25 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar42,5);
      auVar37 = vpbroadcastd_avx512vl(ZEXT416(0x20));
      bVar33 = (bool)((byte)uVar25 & 1);
      bVar8 = (bool)((byte)(uVar25 >> 1) & 1);
      bVar9 = (bool)((byte)(uVar25 >> 2) & 1);
      bVar10 = (bool)((byte)(uVar25 >> 3) & 1);
      tray.nearXYZ.field_0._16_4_ = (uint)bVar33 * auVar37._0_4_ | (uint)!bVar33 * 0x30;
      tray.nearXYZ.field_0._20_4_ = (uint)bVar8 * auVar37._4_4_ | (uint)!bVar8 * 0x30;
      tray.nearXYZ.field_0._24_4_ = (uint)bVar9 * auVar37._8_4_ | (uint)!bVar9 * 0x30;
      tray.nearXYZ.field_0._28_4_ = (uint)bVar10 * auVar37._12_4_ | (uint)!bVar10 * 0x30;
      uVar25 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar42,5);
      auVar37 = vpbroadcastd_avx512vl(ZEXT416(0x40));
      bVar33 = (bool)((byte)uVar25 & 1);
      bVar8 = (bool)((byte)(uVar25 >> 1) & 1);
      bVar9 = (bool)((byte)(uVar25 >> 2) & 1);
      bVar10 = (bool)((byte)(uVar25 >> 3) & 1);
      tray.nearXYZ.field_0._32_4_ = (uint)bVar33 * auVar37._0_4_ | (uint)!bVar33 * 0x50;
      tray.nearXYZ.field_0._36_4_ = (uint)bVar8 * auVar37._4_4_ | (uint)!bVar8 * 0x50;
      tray.nearXYZ.field_0._40_4_ = (uint)bVar9 * auVar37._8_4_ | (uint)!bVar9 * 0x50;
      tray.nearXYZ.field_0._44_4_ = (uint)bVar10 * auVar37._12_4_ | (uint)!bVar10 * 0x50;
      stack_near[0].field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vbroadcastss_avx512vl(ZEXT416(0x7f800000))
      ;
      auVar109 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      auVar37 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x30),auVar42);
      tray.tnear.field_0._0_4_ =
           (uint)(bVar35 & 1) * auVar37._0_4_ |
           (uint)!(bool)(bVar35 & 1) * stack_near[0].field_0._0_4_;
      bVar33 = (bool)((byte)(uVar36 >> 1) & 1);
      tray.tnear.field_0._4_4_ =
           (uint)bVar33 * auVar37._4_4_ | (uint)!bVar33 * stack_near[0].field_0._4_4_;
      bVar33 = (bool)((byte)(uVar36 >> 2) & 1);
      tray.tnear.field_0._8_4_ =
           (uint)bVar33 * auVar37._8_4_ | (uint)!bVar33 * stack_near[0].field_0._8_4_;
      bVar33 = SUB81(uVar36 >> 3,0);
      tray.tnear.field_0._12_4_ =
           (uint)bVar33 * auVar37._12_4_ | (uint)!bVar33 * stack_near[0].field_0._12_4_;
      auVar37 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar108 = ZEXT1664(auVar37);
      auVar42 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),auVar42);
      tray.tfar.field_0.i[0] =
           (uint)(bVar35 & 1) * auVar42._0_4_ | (uint)!(bool)(bVar35 & 1) * auVar37._0_4_;
      bVar33 = (bool)((byte)(uVar36 >> 1) & 1);
      tray.tfar.field_0.i[1] = (uint)bVar33 * auVar42._4_4_ | (uint)!bVar33 * auVar37._4_4_;
      bVar33 = (bool)((byte)(uVar36 >> 2) & 1);
      tray.tfar.field_0.i[2] = (uint)bVar33 * auVar42._8_4_ | (uint)!bVar33 * auVar37._8_4_;
      bVar33 = SUB81(uVar36 >> 3,0);
      tray.tfar.field_0.i[3] = (uint)bVar33 * auVar42._12_4_ | (uint)!bVar33 * auVar37._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar25 = 3;
      }
      else {
        uVar25 = (ulong)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                        RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      local_1940 = ray + 0x80;
      bVar31 = (byte)((ushort)((short)uVar36 << 0xc) >> 0xc) ^ 0xf;
      pNVar28 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar29 = &stack_near[2].field_0;
      stack_node[1].ptr = (bvh->root).ptr;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
      auVar110 = ZEXT1664(auVar37);
      auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
      auVar104 = ZEXT1664(auVar37);
      auVar37 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar103 = ZEXT1664(auVar37);
      local_1938 = uVar25;
LAB_0073da0b:
      paVar29 = paVar29 + -1;
      root.ptr = pNVar28[-1].ptr;
      pNVar28 = pNVar28 + -1;
      if (root.ptr == 0xfffffffffffffff8) goto LAB_0073e9b3;
      aVar4 = *paVar29;
      uVar36 = vcmpps_avx512vl((undefined1  [16])aVar4,(undefined1  [16])tray.tfar.field_0,1);
      if ((char)uVar36 == '\0') {
LAB_0073e9e9:
        iVar22 = 2;
      }
      else {
        uVar30 = (undefined4)uVar36;
        iVar22 = 0;
        if ((uint)POPCOUNT(uVar30) <= uVar25) {
          do {
            sVar27 = 0;
            for (uVar25 = uVar36; (uVar25 & 1) == 0; uVar25 = uVar25 >> 1 | 0x8000000000000000) {
              sVar27 = sVar27 + 1;
            }
            bVar33 = occluded1(This,bvh,root,sVar27,&pre,ray,&tray,context);
            bVar21 = (byte)(1 << ((uint)sVar27 & 0x1f));
            if (!bVar33) {
              bVar21 = 0;
            }
            bVar31 = bVar31 | bVar21;
            uVar36 = uVar36 - 1 & uVar36;
          } while (uVar36 != 0);
          if (bVar31 == 0xf) {
            iVar22 = 3;
          }
          else {
            auVar37 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            tray.tfar.field_0.i[0] =
                 (uint)(bVar31 & 1) * auVar37._0_4_ |
                 (uint)!(bool)(bVar31 & 1) * tray.tfar.field_0.i[0];
            bVar33 = (bool)(bVar31 >> 1 & 1);
            tray.tfar.field_0.i[1] =
                 (uint)bVar33 * auVar37._4_4_ | (uint)!bVar33 * tray.tfar.field_0.i[1];
            bVar33 = (bool)(bVar31 >> 2 & 1);
            tray.tfar.field_0.i[2] =
                 (uint)bVar33 * auVar37._8_4_ | (uint)!bVar33 * tray.tfar.field_0.i[2];
            bVar33 = (bool)(bVar31 >> 3 & 1);
            tray.tfar.field_0.i[3] =
                 (uint)bVar33 * auVar37._12_4_ | (uint)!bVar33 * tray.tfar.field_0.i[3];
            iVar22 = 2;
          }
          auVar37 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          auVar105 = ZEXT1664(auVar37);
          auVar37 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
          auVar106 = ZEXT1664(auVar37);
          auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar107 = ZEXT1664(auVar37);
          auVar37 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
          auVar108 = ZEXT1664(auVar37);
          auVar37 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
          auVar109 = ZEXT1664(auVar37);
          auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
          auVar110 = ZEXT1664(auVar37);
          auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
          auVar104 = ZEXT1664(auVar37);
          auVar37 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
          auVar103 = ZEXT1664(auVar37);
        }
        auVar95 = ZEXT1664((undefined1  [16])aVar4);
        uVar25 = local_1938;
        if (local_1938 < (uint)POPCOUNT(uVar30)) {
          do {
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_0073e9b3;
              uVar11 = vcmpps_avx512vl(auVar95._0_16_,(undefined1  [16])tray.tfar.field_0,9);
              if ((char)uVar11 == '\0') goto LAB_0073e9e9;
              uVar36 = (ulong)((uint)root.ptr & 0xf);
              bVar21 = bVar31 & 0xf;
              if (uVar36 == 8) goto LAB_0073e9aa;
              bVar21 = bVar21 ^ 0xf;
              lVar26 = (root.ptr & 0xfffffffffffffff0) + 0xc0;
              uVar25 = 0;
              goto LAB_0073dc4a;
            }
            auVar95 = ZEXT1664(auVar109._0_16_);
            uVar36 = 0;
            sVar27 = 8;
            do {
              sVar5 = *(size_t *)((root.ptr & 0xfffffffffffffff0) + uVar36 * 8);
              if (sVar5 != 8) {
                uVar30 = *(undefined4 *)(root.ptr + 0x20 + uVar36 * 4);
                auVar68._4_4_ = uVar30;
                auVar68._0_4_ = uVar30;
                auVar68._8_4_ = uVar30;
                auVar68._12_4_ = uVar30;
                auVar17._8_8_ = tray.org.field_0._8_8_;
                auVar17._0_8_ = tray.org.field_0._0_8_;
                auVar18._8_8_ = tray.org.field_0._24_8_;
                auVar18._0_8_ = tray.org.field_0._16_8_;
                auVar19._8_8_ = tray.org.field_0._40_8_;
                auVar19._0_8_ = tray.org.field_0._32_8_;
                auVar37 = vsubps_avx(auVar68,auVar17);
                auVar87._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar37._0_4_;
                auVar87._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar37._4_4_;
                auVar87._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar37._8_4_;
                auVar87._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar37._12_4_;
                uVar30 = *(undefined4 *)(root.ptr + 0x40 + uVar36 * 4);
                auVar69._4_4_ = uVar30;
                auVar69._0_4_ = uVar30;
                auVar69._8_4_ = uVar30;
                auVar69._12_4_ = uVar30;
                auVar37 = vsubps_avx(auVar69,auVar18);
                auVar89._0_4_ = tray.rdir.field_0._16_4_ * auVar37._0_4_;
                auVar89._4_4_ = tray.rdir.field_0._20_4_ * auVar37._4_4_;
                auVar89._8_4_ = tray.rdir.field_0._24_4_ * auVar37._8_4_;
                auVar89._12_4_ = tray.rdir.field_0._28_4_ * auVar37._12_4_;
                uVar30 = *(undefined4 *)(root.ptr + 0x60 + uVar36 * 4);
                auVar70._4_4_ = uVar30;
                auVar70._0_4_ = uVar30;
                auVar70._8_4_ = uVar30;
                auVar70._12_4_ = uVar30;
                auVar37 = vsubps_avx(auVar70,auVar19);
                auVar92._0_4_ = tray.rdir.field_0._32_4_ * auVar37._0_4_;
                auVar92._4_4_ = tray.rdir.field_0._36_4_ * auVar37._4_4_;
                auVar92._8_4_ = tray.rdir.field_0._40_4_ * auVar37._8_4_;
                auVar92._12_4_ = tray.rdir.field_0._44_4_ * auVar37._12_4_;
                uVar30 = *(undefined4 *)(root.ptr + 0x30 + uVar36 * 4);
                auVar71._4_4_ = uVar30;
                auVar71._0_4_ = uVar30;
                auVar71._8_4_ = uVar30;
                auVar71._12_4_ = uVar30;
                auVar37 = vsubps_avx(auVar71,auVar17);
                auVar74._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar37._0_4_;
                auVar74._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar37._4_4_;
                auVar74._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar37._8_4_;
                auVar74._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar37._12_4_;
                uVar30 = *(undefined4 *)(root.ptr + 0x50 + uVar36 * 4);
                auVar72._4_4_ = uVar30;
                auVar72._0_4_ = uVar30;
                auVar72._8_4_ = uVar30;
                auVar72._12_4_ = uVar30;
                auVar37 = vsubps_avx(auVar72,auVar18);
                auVar76._0_4_ = tray.rdir.field_0._16_4_ * auVar37._0_4_;
                auVar76._4_4_ = tray.rdir.field_0._20_4_ * auVar37._4_4_;
                auVar76._8_4_ = tray.rdir.field_0._24_4_ * auVar37._8_4_;
                auVar76._12_4_ = tray.rdir.field_0._28_4_ * auVar37._12_4_;
                uVar30 = *(undefined4 *)(root.ptr + 0x70 + uVar36 * 4);
                auVar73._4_4_ = uVar30;
                auVar73._0_4_ = uVar30;
                auVar73._8_4_ = uVar30;
                auVar73._12_4_ = uVar30;
                auVar37 = vsubps_avx(auVar73,auVar19);
                auVar79._0_4_ = tray.rdir.field_0._32_4_ * auVar37._0_4_;
                auVar79._4_4_ = tray.rdir.field_0._36_4_ * auVar37._4_4_;
                auVar79._8_4_ = tray.rdir.field_0._40_4_ * auVar37._8_4_;
                auVar79._12_4_ = tray.rdir.field_0._44_4_ * auVar37._12_4_;
                auVar37 = vminps_avx(auVar87,auVar74);
                auVar42 = vminps_avx(auVar89,auVar76);
                auVar37 = vmaxps_avx(auVar37,auVar42);
                auVar42 = vminps_avx(auVar92,auVar79);
                auVar37 = vmaxps_avx(auVar37,auVar42);
                auVar38 = vmulps_avx512vl(auVar37,auVar110._0_16_);
                auVar37 = vmaxps_avx(auVar87,auVar74);
                auVar42 = vmaxps_avx(auVar89,auVar76);
                auVar42 = vminps_avx(auVar37,auVar42);
                auVar37 = vmaxps_avx(auVar92,auVar79);
                auVar37 = vminps_avx(auVar42,auVar37);
                auVar42 = vmulps_avx512vl(auVar37,auVar104._0_16_);
                auVar37 = vmaxps_avx(auVar38,(undefined1  [16])tray.tnear.field_0);
                auVar42 = vminps_avx(auVar42,(undefined1  [16])tray.tfar.field_0);
                uVar32 = vcmpps_avx512vl(auVar37,auVar42,2);
                if ((byte)uVar32 != 0) {
                  auVar37 = vblendmps_avx512vl(auVar109._0_16_,auVar38);
                  bVar33 = (bool)((byte)uVar32 & 1);
                  bVar8 = (bool)((byte)(uVar32 >> 1) & 1);
                  bVar9 = (bool)((byte)(uVar32 >> 2) & 1);
                  bVar10 = (bool)((byte)(uVar32 >> 3) & 1);
                  if (sVar27 != 8) {
                    pNVar28->ptr = sVar27;
                    pNVar28 = pNVar28 + 1;
                    *paVar29 = auVar95._0_16_;
                    paVar29 = paVar29 + 1;
                  }
                  auVar95 = ZEXT1664(CONCAT412((uint)bVar10 * auVar37._12_4_ |
                                               (uint)!bVar10 * auVar38._12_4_,
                                               CONCAT48((uint)bVar9 * auVar37._8_4_ |
                                                        (uint)!bVar9 * auVar38._8_4_,
                                                        CONCAT44((uint)bVar8 * auVar37._4_4_ |
                                                                 (uint)!bVar8 * auVar38._4_4_,
                                                                 (uint)bVar33 * auVar37._0_4_ |
                                                                 (uint)!bVar33 * auVar38._0_4_))));
                  sVar27 = sVar5;
                }
              }
            } while ((sVar5 != 8) && (bVar33 = uVar36 < 3, uVar36 = uVar36 + 1, bVar33));
            iVar22 = 0;
            if (sVar27 == 8) {
LAB_0073dbf6:
              bVar33 = false;
              iVar22 = 4;
            }
            else {
              uVar11 = vcmpps_avx512vl((undefined1  [16])auVar95._0_16_,
                                       (undefined1  [16])tray.tfar.field_0,9);
              bVar33 = true;
              if ((uint)POPCOUNT((int)uVar11) <= local_1938) {
                pNVar28->ptr = sVar27;
                pNVar28 = pNVar28 + 1;
                *paVar29 = auVar95._0_16_;
                paVar29 = paVar29 + 1;
                goto LAB_0073dbf6;
              }
            }
            root.ptr = sVar27;
          } while (bVar33);
        }
      }
      goto LAB_0073e9db;
    }
  }
  return;
  while( true ) {
    uVar25 = uVar25 + 1;
    lVar26 = lVar26 + 0xe0;
    if (uVar36 - 8 <= uVar25) break;
LAB_0073dc4a:
    uVar32 = 0;
    bVar24 = bVar21;
    while (uVar34 = (ulong)*(uint *)(lVar26 + uVar32 * 4), uVar34 != 0xffffffff) {
      uVar30 = *(undefined4 *)(lVar26 + -0xc0 + uVar32 * 4);
      auVar62._4_4_ = uVar30;
      auVar62._0_4_ = uVar30;
      auVar62._8_4_ = uVar30;
      auVar62._12_4_ = uVar30;
      uVar30 = *(undefined4 *)(lVar26 + -0xb0 + uVar32 * 4);
      auVar75._4_4_ = uVar30;
      auVar75._0_4_ = uVar30;
      auVar75._8_4_ = uVar30;
      auVar75._12_4_ = uVar30;
      uVar30 = *(undefined4 *)(lVar26 + -0xa0 + uVar32 * 4);
      auVar77._4_4_ = uVar30;
      auVar77._0_4_ = uVar30;
      auVar77._8_4_ = uVar30;
      auVar77._12_4_ = uVar30;
      uVar30 = *(undefined4 *)(lVar26 + -0x90 + uVar32 * 4);
      auVar100._4_4_ = uVar30;
      auVar100._0_4_ = uVar30;
      auVar100._8_4_ = uVar30;
      auVar100._12_4_ = uVar30;
      uVar30 = *(undefined4 *)(lVar26 + -0x80 + uVar32 * 4);
      auVar101._4_4_ = uVar30;
      auVar101._0_4_ = uVar30;
      auVar101._8_4_ = uVar30;
      auVar101._12_4_ = uVar30;
      uVar30 = *(undefined4 *)(lVar26 + -0x70 + uVar32 * 4);
      auVar102._4_4_ = uVar30;
      auVar102._0_4_ = uVar30;
      auVar102._8_4_ = uVar30;
      auVar102._12_4_ = uVar30;
      uVar30 = *(undefined4 *)(lVar26 + -0x60 + uVar32 * 4);
      uVar1 = *(undefined4 *)(lVar26 + -0x50 + uVar32 * 4);
      uVar2 = *(undefined4 *)(lVar26 + -0x40 + uVar32 * 4);
      auVar43 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar26 + -0x30 + uVar32 * 4)));
      auVar44 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar26 + -0x20 + uVar32 * 4)));
      auVar45 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar26 + -0x10 + uVar32 * 4)));
      auVar37 = *(undefined1 (*) [16])ray;
      auVar42 = *(undefined1 (*) [16])(ray + 0x10);
      auVar38 = *(undefined1 (*) [16])(ray + 0x20);
      auVar39 = *(undefined1 (*) [16])(ray + 0x40);
      auVar40 = *(undefined1 (*) [16])(ray + 0x50);
      auVar41 = *(undefined1 (*) [16])(ray + 0x60);
      auVar62 = vsubps_avx(auVar62,auVar37);
      auVar75 = vsubps_avx(auVar75,auVar42);
      auVar77 = vsubps_avx(auVar77,auVar38);
      auVar59 = vsubps_avx(auVar100,auVar37);
      auVar60 = vsubps_avx(auVar101,auVar42);
      auVar46 = vsubps_avx512vl(auVar102,auVar38);
      auVar47 = vsubps_avx512vl(auVar43,auVar37);
      auVar48 = vsubps_avx512vl(auVar44,auVar42);
      auVar49 = vsubps_avx512vl(auVar45,auVar38);
      auVar50 = vsubps_avx512vl(auVar47,auVar62);
      auVar51 = vsubps_avx512vl(auVar48,auVar75);
      auVar52 = vsubps_avx512vl(auVar49,auVar77);
      auVar53 = vsubps_avx512vl(auVar62,auVar59);
      auVar54 = vsubps_avx512vl(auVar75,auVar60);
      auVar55 = vsubps_avx512vl(auVar77,auVar46);
      auVar38 = vaddps_avx512vl(auVar47,auVar62);
      auVar56 = vaddps_avx512vl(auVar48,auVar75);
      auVar37 = vaddps_avx512vl(auVar49,auVar77);
      auVar42._0_4_ = auVar52._0_4_ * auVar56._0_4_;
      auVar42._4_4_ = auVar52._4_4_ * auVar56._4_4_;
      auVar42._8_4_ = auVar52._8_4_ * auVar56._8_4_;
      auVar42._12_4_ = auVar52._12_4_ * auVar56._12_4_;
      auVar42 = vfmsub231ps_fma(auVar42,auVar51,auVar37);
      auVar61._0_4_ = auVar50._0_4_ * auVar37._0_4_;
      auVar61._4_4_ = auVar50._4_4_ * auVar37._4_4_;
      auVar61._8_4_ = auVar50._8_4_ * auVar37._8_4_;
      auVar61._12_4_ = auVar50._12_4_ * auVar37._12_4_;
      auVar37 = vfmsub231ps_fma(auVar61,auVar52,auVar38);
      auVar57._0_4_ = auVar51._0_4_ * auVar38._0_4_;
      auVar57._4_4_ = auVar51._4_4_ * auVar38._4_4_;
      auVar57._8_4_ = auVar51._8_4_ * auVar38._8_4_;
      auVar57._12_4_ = auVar51._12_4_ * auVar38._12_4_;
      auVar38 = vfmsub231ps_fma(auVar57,auVar50,auVar56);
      fVar93 = auVar41._0_4_;
      auVar56._0_4_ = fVar93 * auVar38._0_4_;
      fVar96 = auVar41._4_4_;
      auVar56._4_4_ = fVar96 * auVar38._4_4_;
      fVar97 = auVar41._8_4_;
      auVar56._8_4_ = fVar97 * auVar38._8_4_;
      fVar98 = auVar41._12_4_;
      auVar56._12_4_ = fVar98 * auVar38._12_4_;
      auVar37 = vfmadd231ps_fma(auVar56,auVar40,auVar37);
      auVar37 = vfmadd231ps_fma(auVar37,auVar39,auVar42);
      auVar58._0_4_ = auVar59._0_4_ + auVar62._0_4_;
      auVar58._4_4_ = auVar59._4_4_ + auVar62._4_4_;
      auVar58._8_4_ = auVar59._8_4_ + auVar62._8_4_;
      auVar58._12_4_ = auVar59._12_4_ + auVar62._12_4_;
      auVar78._0_4_ = auVar60._0_4_ + auVar75._0_4_;
      auVar78._4_4_ = auVar60._4_4_ + auVar75._4_4_;
      auVar78._8_4_ = auVar60._8_4_ + auVar75._8_4_;
      auVar78._12_4_ = auVar60._12_4_ + auVar75._12_4_;
      auVar42 = vaddps_avx512vl(auVar77,auVar46);
      auVar38 = vmulps_avx512vl(auVar78,auVar55);
      auVar38 = vfmsub231ps_avx512vl(auVar38,auVar54,auVar42);
      auVar42 = vmulps_avx512vl(auVar42,auVar53);
      auVar42 = vfmsub231ps_avx512vl(auVar42,auVar55,auVar58);
      auVar56 = vmulps_avx512vl(auVar58,auVar54);
      auVar56 = vfmsub231ps_avx512vl(auVar56,auVar53,auVar78);
      auVar57 = vsubps_avx512vl(auVar59,auVar47);
      auVar80._0_4_ = fVar93 * auVar56._0_4_;
      auVar80._4_4_ = fVar96 * auVar56._4_4_;
      auVar80._8_4_ = fVar97 * auVar56._8_4_;
      auVar80._12_4_ = fVar98 * auVar56._12_4_;
      auVar42 = vfmadd231ps_avx512vl(auVar80,auVar40,auVar42);
      auVar56 = vsubps_avx512vl(auVar60,auVar48);
      auVar42 = vfmadd231ps_fma(auVar42,auVar39,auVar38);
      auVar58 = vsubps_avx512vl(auVar46,auVar49);
      auVar38 = vaddps_avx512vl(auVar59,auVar47);
      auVar59 = vaddps_avx512vl(auVar60,auVar48);
      auVar60 = vaddps_avx512vl(auVar46,auVar49);
      auVar46 = vmulps_avx512vl(auVar59,auVar58);
      auVar46 = vfmsub231ps_avx512vl(auVar46,auVar56,auVar60);
      auVar60 = vmulps_avx512vl(auVar60,auVar57);
      auVar60 = vfmsub231ps_avx512vl(auVar60,auVar58,auVar38);
      auVar47._0_4_ = auVar38._0_4_ * auVar56._0_4_;
      auVar47._4_4_ = auVar38._4_4_ * auVar56._4_4_;
      auVar47._8_4_ = auVar38._8_4_ * auVar56._8_4_;
      auVar47._12_4_ = auVar38._12_4_ * auVar56._12_4_;
      auVar38 = vfmsub231ps_fma(auVar47,auVar57,auVar59);
      auVar38 = vmulps_avx512vl(auVar38,auVar41);
      auVar38 = vfmadd231ps_avx512vl(auVar38,auVar40,auVar60);
      auVar41 = vfmadd231ps_avx512vl(auVar38,auVar39,auVar46);
      auVar59._0_4_ = auVar37._0_4_ + auVar42._0_4_;
      auVar59._4_4_ = auVar37._4_4_ + auVar42._4_4_;
      auVar59._8_4_ = auVar37._8_4_ + auVar42._8_4_;
      auVar59._12_4_ = auVar37._12_4_ + auVar42._12_4_;
      auVar59 = vaddps_avx512vl(auVar41,auVar59);
      auVar48 = auVar105._0_16_;
      auVar60 = vandps_avx512vl(auVar59,auVar48);
      auVar38._8_4_ = 0x34000000;
      auVar38._0_8_ = 0x3400000034000000;
      auVar38._12_4_ = 0x34000000;
      auVar38 = vmulps_avx512vl(auVar60,auVar38);
      auVar46 = vminps_avx512vl(auVar37,auVar42);
      auVar46 = vminps_avx512vl(auVar46,auVar41);
      auVar47 = vxorps_avx512vl(auVar38,auVar103._0_16_);
      uVar11 = vcmpps_avx512vl(auVar46,auVar47,5);
      auVar46 = vmaxps_avx512vl(auVar37,auVar42);
      auVar41 = vmaxps_avx512vl(auVar46,auVar41);
      uVar12 = vcmpps_avx512vl(auVar41,auVar38,2);
      bVar23 = ((byte)uVar11 | (byte)uVar12) & 0xf & bVar24;
      if (bVar23 != 0) {
        auVar38 = vmulps_avx512vl(auVar54,auVar52);
        auVar41 = vmulps_avx512vl(auVar50,auVar55);
        auVar46 = vmulps_avx512vl(auVar53,auVar51);
        auVar47 = vmulps_avx512vl(auVar56,auVar55);
        auVar49 = vmulps_avx512vl(auVar53,auVar58);
        auVar61 = vmulps_avx512vl(auVar57,auVar54);
        auVar51 = vfmsub213ps_avx512vl(auVar51,auVar55,auVar38);
        auVar52 = vfmsub213ps_avx512vl(auVar52,auVar53,auVar41);
        auVar50 = vfmsub213ps_avx512vl(auVar50,auVar54,auVar46);
        auVar54 = vfmsub213ps_avx512vl(auVar58,auVar54,auVar47);
        auVar55 = vfmsub213ps_avx512vl(auVar57,auVar55,auVar49);
        auVar53 = vfmsub213ps_avx512vl(auVar56,auVar53,auVar61);
        auVar38 = vandps_avx512vl(auVar38,auVar48);
        auVar47 = vandps_avx512vl(auVar47,auVar48);
        uVar13 = vcmpps_avx512vl(auVar38,auVar47,1);
        auVar38 = vandps_avx512vl(auVar41,auVar48);
        auVar41 = vandps_avx512vl(auVar49,auVar48);
        uVar14 = vcmpps_avx512vl(auVar38,auVar41,1);
        auVar38 = vandps_avx512vl(auVar46,auVar48);
        auVar41 = vandps_avx512vl(auVar61,auVar48);
        auVar46 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar103 = ZEXT1664(auVar46);
        uVar15 = vcmpps_avx512vl(auVar38,auVar41,1);
        bVar33 = (bool)((byte)uVar13 & 1);
        auVar41._0_4_ = (uint)bVar33 * auVar51._0_4_ | (uint)!bVar33 * auVar54._0_4_;
        bVar33 = (bool)((byte)(uVar13 >> 1) & 1);
        auVar41._4_4_ = (uint)bVar33 * auVar51._4_4_ | (uint)!bVar33 * auVar54._4_4_;
        bVar33 = (bool)((byte)(uVar13 >> 2) & 1);
        auVar41._8_4_ = (uint)bVar33 * auVar51._8_4_ | (uint)!bVar33 * auVar54._8_4_;
        bVar33 = (bool)((byte)(uVar13 >> 3) & 1);
        auVar41._12_4_ = (uint)bVar33 * auVar51._12_4_ | (uint)!bVar33 * auVar54._12_4_;
        bVar33 = (bool)((byte)uVar14 & 1);
        auVar48._0_4_ = (uint)bVar33 * auVar52._0_4_ | (uint)!bVar33 * auVar55._0_4_;
        bVar33 = (bool)((byte)(uVar14 >> 1) & 1);
        auVar48._4_4_ = (uint)bVar33 * auVar52._4_4_ | (uint)!bVar33 * auVar55._4_4_;
        bVar33 = (bool)((byte)(uVar14 >> 2) & 1);
        auVar48._8_4_ = (uint)bVar33 * auVar52._8_4_ | (uint)!bVar33 * auVar55._8_4_;
        bVar33 = (bool)((byte)(uVar14 >> 3) & 1);
        auVar48._12_4_ = (uint)bVar33 * auVar52._12_4_ | (uint)!bVar33 * auVar55._12_4_;
        bVar33 = (bool)((byte)uVar15 & 1);
        auVar49._0_4_ = (float)((uint)bVar33 * auVar50._0_4_ | (uint)!bVar33 * auVar53._0_4_);
        bVar33 = (bool)((byte)(uVar15 >> 1) & 1);
        auVar49._4_4_ = (float)((uint)bVar33 * auVar50._4_4_ | (uint)!bVar33 * auVar53._4_4_);
        bVar33 = (bool)((byte)(uVar15 >> 2) & 1);
        auVar49._8_4_ = (float)((uint)bVar33 * auVar50._8_4_ | (uint)!bVar33 * auVar53._8_4_);
        bVar33 = (bool)((byte)(uVar15 >> 3) & 1);
        auVar49._12_4_ = (float)((uint)bVar33 * auVar50._12_4_ | (uint)!bVar33 * auVar53._12_4_);
        auVar51._0_4_ = fVar93 * auVar49._0_4_;
        auVar51._4_4_ = fVar96 * auVar49._4_4_;
        auVar51._8_4_ = fVar97 * auVar49._8_4_;
        auVar51._12_4_ = fVar98 * auVar49._12_4_;
        auVar38 = vfmadd213ps_fma(auVar40,auVar48,auVar51);
        auVar38 = vfmadd213ps_fma(auVar39,auVar41,auVar38);
        auVar50._0_4_ = auVar38._0_4_ + auVar38._0_4_;
        auVar50._4_4_ = auVar38._4_4_ + auVar38._4_4_;
        auVar50._8_4_ = auVar38._8_4_ + auVar38._8_4_;
        auVar50._12_4_ = auVar38._12_4_ + auVar38._12_4_;
        auVar39._0_4_ = auVar77._0_4_ * auVar49._0_4_;
        auVar39._4_4_ = auVar77._4_4_ * auVar49._4_4_;
        auVar39._8_4_ = auVar77._8_4_ * auVar49._8_4_;
        auVar39._12_4_ = auVar77._12_4_ * auVar49._12_4_;
        auVar38 = vfmadd213ps_fma(auVar75,auVar48,auVar39);
        auVar40 = vfmadd213ps_fma(auVar62,auVar41,auVar38);
        auVar38 = vrcp14ps_avx512vl(auVar50);
        auVar62 = vxorps_avx512vl(auVar50,auVar46);
        auVar75 = auVar107._0_16_;
        auVar39 = vfnmadd213ps_avx512vl(auVar38,auVar50,auVar75);
        auVar39 = vfmadd132ps_fma(auVar39,auVar38,auVar38);
        auVar38 = *(undefined1 (*) [16])(ray + 0x80);
        auVar46._0_4_ = auVar39._0_4_ * (auVar40._0_4_ + auVar40._0_4_);
        auVar46._4_4_ = auVar39._4_4_ * (auVar40._4_4_ + auVar40._4_4_);
        auVar46._8_4_ = auVar39._8_4_ * (auVar40._8_4_ + auVar40._8_4_);
        auVar46._12_4_ = auVar39._12_4_ * (auVar40._12_4_ + auVar40._12_4_);
        uVar11 = vcmpps_avx512vl(auVar46,auVar38,2);
        uVar12 = vcmpps_avx512vl(auVar46,*(undefined1 (*) [16])(ray + 0x30),0xd);
        uVar16 = vcmpps_avx512vl(auVar50,auVar62,4);
        bVar23 = bVar23 & (byte)uVar11 & (byte)uVar12 & (byte)uVar16;
        if (bVar23 != 0) {
          pGVar6 = (context->scene->geometries).items[uVar34].ptr;
          uVar3 = pGVar6->mask;
          auVar40._4_4_ = uVar3;
          auVar40._0_4_ = uVar3;
          auVar40._8_4_ = uVar3;
          auVar40._12_4_ = uVar3;
          uVar11 = vptestmd_avx512vl(auVar40,*(undefined1 (*) [16])(ray + 0x90));
          bVar23 = bVar23 & (byte)uVar11 & 0xf;
          uVar34 = (ulong)bVar23;
          if (bVar23 != 0) {
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              uVar34 = vcmpps_avx512vl(auVar60,auVar106._0_16_,5);
              auVar39 = vrcp14ps_avx512vl(auVar59);
              auVar40 = vfnmadd213ps_avx512vl(auVar59,auVar39,auVar75);
              auVar39 = vfmadd132ps_avx512vl(auVar40,auVar39,auVar39);
              fVar93 = (float)((uint)((byte)uVar34 & 1) * auVar39._0_4_);
              fVar96 = (float)((uint)((byte)(uVar34 >> 1) & 1) * auVar39._4_4_);
              fVar97 = (float)((uint)((byte)(uVar34 >> 2) & 1) * auVar39._8_4_);
              fVar98 = (float)((uint)((byte)(uVar34 >> 3) & 1) * auVar39._12_4_);
              auVar60._0_4_ = fVar93 * auVar37._0_4_;
              auVar60._4_4_ = fVar96 * auVar37._4_4_;
              auVar60._8_4_ = fVar97 * auVar37._8_4_;
              auVar60._12_4_ = fVar98 * auVar37._12_4_;
              local_1898 = vminps_avx512vl(auVar60,auVar75);
              auVar37._0_4_ = fVar93 * auVar42._0_4_;
              auVar37._4_4_ = fVar96 * auVar42._4_4_;
              auVar37._8_4_ = fVar97 * auVar42._8_4_;
              auVar37._12_4_ = fVar98 * auVar42._12_4_;
              local_1888 = vminps_avx512vl(auVar37,auVar75);
              local_1868 = vpbroadcastd_avx512vl();
              local_1878 = vpbroadcastd_avx512vl();
              local_18c8[0] = (RTCHitN)(char)auVar41._0_4_;
              local_18c8[1] = (RTCHitN)(char)(auVar41._0_4_ >> 8);
              local_18c8[2] = (RTCHitN)(char)(auVar41._0_4_ >> 0x10);
              local_18c8[3] = (RTCHitN)(char)(auVar41._0_4_ >> 0x18);
              local_18c8[4] = (RTCHitN)(char)auVar41._4_4_;
              local_18c8[5] = (RTCHitN)(char)(auVar41._4_4_ >> 8);
              local_18c8[6] = (RTCHitN)(char)(auVar41._4_4_ >> 0x10);
              local_18c8[7] = (RTCHitN)(char)(auVar41._4_4_ >> 0x18);
              local_18c8[8] = (RTCHitN)(char)auVar41._8_4_;
              local_18c8[9] = (RTCHitN)(char)(auVar41._8_4_ >> 8);
              local_18c8[10] = (RTCHitN)(char)(auVar41._8_4_ >> 0x10);
              local_18c8[0xb] = (RTCHitN)(char)(auVar41._8_4_ >> 0x18);
              local_18c8[0xc] = (RTCHitN)(char)auVar41._12_4_;
              local_18c8[0xd] = (RTCHitN)(char)(auVar41._12_4_ >> 8);
              local_18c8[0xe] = (RTCHitN)(char)(auVar41._12_4_ >> 0x10);
              local_18c8[0xf] = (RTCHitN)(char)(auVar41._12_4_ >> 0x18);
              local_18b8 = auVar48;
              local_18a8 = auVar49;
              vpcmpeqd_avx2(ZEXT1632(local_1898),ZEXT1632(local_1898));
              uStack_1854 = context->user->instID[0];
              local_1858 = uStack_1854;
              uStack_1850 = uStack_1854;
              uStack_184c = uStack_1854;
              uStack_1848 = context->user->instPrimID[0];
              uStack_1844 = uStack_1848;
              uStack_1840 = uStack_1848;
              uStack_183c = uStack_1848;
              auVar37 = vblendmps_avx512vl(auVar38,auVar46);
              bVar33 = (bool)(bVar23 >> 1 & 1);
              bVar8 = (bool)(bVar23 >> 2 & 1);
              *(uint *)(ray + 0x80) =
                   (uint)(bVar23 & 1) * auVar37._0_4_ | !(bool)(bVar23 & 1) * uStack_1848;
              *(uint *)(ray + 0x84) = (uint)bVar33 * auVar37._4_4_ | !bVar33 * uStack_1848;
              *(uint *)(ray + 0x88) = (uint)bVar8 * auVar37._8_4_ | !bVar8 * uStack_1848;
              *(uint *)(ray + 0x8c) =
                   (uint)(bVar23 >> 3) * auVar37._12_4_ | !(bool)(bVar23 >> 3) * uStack_1848;
              local_1958 = vpmovm2d_avx512vl((ulong)bVar23);
              args.valid = (int *)local_1958;
              args.geometryUserPtr = pGVar6->userPtr;
              args.context = context->user;
              args.hit = local_18c8;
              args.N = 4;
              args.ray = (RTCRayN *)ray;
              if (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                local_1948 = ray;
                (*pGVar6->occlusionFilterN)(&args);
                auVar37 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                auVar103 = ZEXT1664(auVar37);
                auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                auVar104 = ZEXT1664(auVar37);
                auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                auVar110 = ZEXT1664(auVar37);
                auVar37 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                auVar109 = ZEXT1664(auVar37);
                auVar37 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                auVar108 = ZEXT1664(auVar37);
                auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                auVar107 = ZEXT1664(auVar37);
                auVar37 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
                auVar106 = ZEXT1664(auVar37);
                auVar37 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                auVar105 = ZEXT1664(auVar37);
                ray = local_1948;
              }
              uVar34 = vptestmd_avx512vl(local_1958,local_1958);
              uVar34 = uVar34 & 0xf;
              if ((char)uVar34 != '\0') {
                p_Var7 = context->args->filter;
                if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar6->field_8).field_0x2 & 0x40) != 0))))
                {
                  (*p_Var7)(&args);
                  auVar37 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                  auVar103 = ZEXT1664(auVar37);
                  auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                  auVar104 = ZEXT1664(auVar37);
                  auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                  auVar110 = ZEXT1664(auVar37);
                  auVar37 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                  auVar109 = ZEXT1664(auVar37);
                  auVar37 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                  auVar108 = ZEXT1664(auVar37);
                  auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                  auVar107 = ZEXT1664(auVar37);
                  auVar37 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
                  auVar106 = ZEXT1664(auVar37);
                  auVar37 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                  auVar105 = ZEXT1664(auVar37);
                }
                uVar34 = vptestmd_avx512vl(local_1958,local_1958);
                uVar34 = uVar34 & 0xf;
                auVar37 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                bVar33 = (bool)((byte)uVar34 & 1);
                auVar52._0_4_ =
                     (uint)bVar33 * auVar37._0_4_ | (uint)!bVar33 * *(int *)(args.ray + 0x80);
                bVar33 = (bool)((byte)(uVar34 >> 1) & 1);
                auVar52._4_4_ =
                     (uint)bVar33 * auVar37._4_4_ | (uint)!bVar33 * *(int *)(args.ray + 0x84);
                bVar33 = (bool)((byte)(uVar34 >> 2) & 1);
                auVar52._8_4_ =
                     (uint)bVar33 * auVar37._8_4_ | (uint)!bVar33 * *(int *)(args.ray + 0x88);
                bVar33 = SUB81(uVar34 >> 3,0);
                auVar52._12_4_ =
                     (uint)bVar33 * auVar37._12_4_ | (uint)!bVar33 * *(int *)(args.ray + 0x8c);
                *(undefined1 (*) [16])(args.ray + 0x80) = auVar52;
              }
              bVar33 = (bool)((byte)uVar34 & 1);
              auVar53._0_4_ = (uint)bVar33 * *(int *)local_1940 | (uint)!bVar33 * auVar38._0_4_;
              bVar33 = (bool)((byte)(uVar34 >> 1) & 1);
              auVar53._4_4_ =
                   (uint)bVar33 * *(int *)(local_1940 + 4) | (uint)!bVar33 * auVar38._4_4_;
              bVar33 = (bool)((byte)(uVar34 >> 2) & 1);
              auVar53._8_4_ =
                   (uint)bVar33 * *(int *)(local_1940 + 8) | (uint)!bVar33 * auVar38._8_4_;
              bVar33 = SUB81(uVar34 >> 3,0);
              auVar53._12_4_ =
                   (uint)bVar33 * *(int *)(local_1940 + 0xc) | (uint)!bVar33 * auVar38._12_4_;
              *(undefined1 (*) [16])local_1940 = auVar53;
            }
            bVar24 = ((byte)uVar34 ^ 0xf) & bVar24;
          }
        }
      }
      if (bVar24 == 0) {
        bVar33 = false;
      }
      else {
        auVar37 = *(undefined1 (*) [16])ray;
        auVar42 = *(undefined1 (*) [16])(ray + 0x10);
        auVar38 = *(undefined1 (*) [16])(ray + 0x20);
        auVar39 = *(undefined1 (*) [16])(ray + 0x40);
        auVar40 = *(undefined1 (*) [16])(ray + 0x50);
        auVar41 = *(undefined1 (*) [16])(ray + 0x60);
        auVar20._4_4_ = uVar30;
        auVar20._0_4_ = uVar30;
        auVar20._8_4_ = uVar30;
        auVar20._12_4_ = uVar30;
        auVar62 = vsubps_avx(auVar20,auVar37);
        auVar55._4_4_ = uVar1;
        auVar55._0_4_ = uVar1;
        auVar55._8_4_ = uVar1;
        auVar55._12_4_ = uVar1;
        auVar75 = vsubps_avx(auVar55,auVar42);
        auVar54._4_4_ = uVar2;
        auVar54._0_4_ = uVar2;
        auVar54._8_4_ = uVar2;
        auVar54._12_4_ = uVar2;
        auVar77 = vsubps_avx(auVar54,auVar38);
        auVar59 = vsubps_avx(auVar43,auVar37);
        auVar60 = vsubps_avx(auVar44,auVar42);
        auVar43 = vsubps_avx512vl(auVar45,auVar38);
        auVar44 = vsubps_avx512vl(auVar100,auVar37);
        auVar42 = vsubps_avx512vl(auVar101,auVar42);
        auVar38 = vsubps_avx512vl(auVar102,auVar38);
        auVar45 = vsubps_avx512vl(auVar44,auVar62);
        auVar46 = vsubps_avx512vl(auVar42,auVar75);
        auVar47 = vsubps_avx512vl(auVar38,auVar77);
        auVar48 = vsubps_avx512vl(auVar62,auVar59);
        auVar49 = vsubps_avx512vl(auVar75,auVar60);
        auVar50 = vsubps_avx512vl(auVar77,auVar43);
        auVar51 = vsubps_avx512vl(auVar59,auVar44);
        auVar52 = vsubps_avx512vl(auVar60,auVar42);
        auVar53 = vsubps_avx512vl(auVar43,auVar38);
        auVar37 = vaddps_avx512vl(auVar44,auVar62);
        auVar54 = vaddps_avx512vl(auVar42,auVar75);
        auVar55 = vaddps_avx512vl(auVar38,auVar77);
        auVar56 = vmulps_avx512vl(auVar54,auVar47);
        auVar56 = vfmsub231ps_avx512vl(auVar56,auVar46,auVar55);
        auVar55 = vmulps_avx512vl(auVar55,auVar45);
        auVar55 = vfmsub231ps_avx512vl(auVar55,auVar47,auVar37);
        auVar81._0_4_ = auVar46._0_4_ * auVar37._0_4_;
        auVar81._4_4_ = auVar46._4_4_ * auVar37._4_4_;
        auVar81._8_4_ = auVar46._8_4_ * auVar37._8_4_;
        auVar81._12_4_ = auVar46._12_4_ * auVar37._12_4_;
        auVar37 = vfmsub231ps_fma(auVar81,auVar45,auVar54);
        fVar93 = auVar41._0_4_;
        auVar82._0_4_ = fVar93 * auVar37._0_4_;
        fVar96 = auVar41._4_4_;
        auVar82._4_4_ = fVar96 * auVar37._4_4_;
        fVar97 = auVar41._8_4_;
        auVar82._8_4_ = fVar97 * auVar37._8_4_;
        fVar98 = auVar41._12_4_;
        auVar82._12_4_ = fVar98 * auVar37._12_4_;
        auVar37 = vfmadd231ps_avx512vl(auVar82,auVar40,auVar55);
        auVar54 = vfmadd231ps_avx512vl(auVar37,auVar39,auVar56);
        auVar84._0_4_ = auVar59._0_4_ + auVar62._0_4_;
        auVar84._4_4_ = auVar59._4_4_ + auVar62._4_4_;
        auVar84._8_4_ = auVar59._8_4_ + auVar62._8_4_;
        auVar84._12_4_ = auVar59._12_4_ + auVar62._12_4_;
        auVar37 = vaddps_avx512vl(auVar75,auVar60);
        auVar55 = vaddps_avx512vl(auVar77,auVar43);
        auVar56 = vmulps_avx512vl(auVar37,auVar50);
        auVar56 = vfmsub231ps_avx512vl(auVar56,auVar49,auVar55);
        auVar55 = vmulps_avx512vl(auVar55,auVar48);
        auVar55 = vfmsub231ps_avx512vl(auVar55,auVar50,auVar84);
        auVar57 = vmulps_avx512vl(auVar84,auVar49);
        auVar37 = vfmsub231ps_avx512vl(auVar57,auVar48,auVar37);
        auVar85._0_4_ = fVar93 * auVar37._0_4_;
        auVar85._4_4_ = fVar96 * auVar37._4_4_;
        auVar85._8_4_ = fVar97 * auVar37._8_4_;
        auVar85._12_4_ = fVar98 * auVar37._12_4_;
        auVar37 = vfmadd231ps_avx512vl(auVar85,auVar40,auVar55);
        auVar55 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar103 = ZEXT1664(auVar55);
        auVar56 = vfmadd231ps_avx512vl(auVar37,auVar39,auVar56);
        auVar37 = vaddps_avx512vl(auVar59,auVar44);
        auVar42 = vaddps_avx512vl(auVar60,auVar42);
        auVar38 = vaddps_avx512vl(auVar43,auVar38);
        auVar59 = vmulps_avx512vl(auVar42,auVar53);
        auVar59 = vfmsub231ps_avx512vl(auVar59,auVar52,auVar38);
        auVar38 = vmulps_avx512vl(auVar38,auVar51);
        auVar38 = vfmsub231ps_avx512vl(auVar38,auVar53,auVar37);
        auVar44._0_4_ = auVar37._0_4_ * auVar52._0_4_;
        auVar44._4_4_ = auVar37._4_4_ * auVar52._4_4_;
        auVar44._8_4_ = auVar37._8_4_ * auVar52._8_4_;
        auVar44._12_4_ = auVar37._12_4_ * auVar52._12_4_;
        auVar37 = vfmsub231ps_fma(auVar44,auVar51,auVar42);
        auVar37 = vmulps_avx512vl(auVar37,auVar41);
        auVar37 = vfmadd231ps_avx512vl(auVar37,auVar40,auVar38);
        auVar37 = vfmadd231ps_avx512vl(auVar37,auVar39,auVar59);
        auVar99._0_4_ = auVar54._0_4_ + auVar56._0_4_;
        auVar99._4_4_ = auVar54._4_4_ + auVar56._4_4_;
        auVar99._8_4_ = auVar54._8_4_ + auVar56._8_4_;
        auVar99._12_4_ = auVar54._12_4_ + auVar56._12_4_;
        auVar42 = vaddps_avx512vl(auVar37,auVar99);
        auVar44 = auVar105._0_16_;
        auVar38 = vandps_avx512vl(auVar42,auVar44);
        auVar43._8_4_ = 0x34000000;
        auVar43._0_8_ = 0x3400000034000000;
        auVar43._12_4_ = 0x34000000;
        auVar41 = vmulps_avx512vl(auVar38,auVar43);
        auVar59 = vminps_avx512vl(auVar54,auVar56);
        auVar59 = vminps_avx512vl(auVar59,auVar37);
        auVar60 = vxorps_avx512vl(auVar41,auVar55);
        uVar11 = vcmpps_avx512vl(auVar59,auVar60,5);
        auVar59 = vmaxps_avx512vl(auVar54,auVar56);
        auVar37 = vmaxps_avx512vl(auVar59,auVar37);
        uVar12 = vcmpps_avx512vl(auVar37,auVar41,2);
        bVar23 = ((byte)uVar11 | (byte)uVar12) & 0xf & bVar24;
        if (bVar23 == 0) {
          auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
          auVar104 = ZEXT1664(auVar37);
        }
        else {
          auVar37 = vmulps_avx512vl(auVar49,auVar47);
          auVar41 = vmulps_avx512vl(auVar45,auVar50);
          auVar59 = vmulps_avx512vl(auVar48,auVar46);
          auVar60 = vmulps_avx512vl(auVar52,auVar50);
          auVar43 = vmulps_avx512vl(auVar48,auVar53);
          auVar55 = vmulps_avx512vl(auVar51,auVar49);
          auVar46 = vfmsub213ps_avx512vl(auVar46,auVar50,auVar37);
          auVar47 = vfmsub213ps_avx512vl(auVar47,auVar48,auVar41);
          auVar45 = vfmsub213ps_avx512vl(auVar45,auVar49,auVar59);
          auVar49 = vfmsub213ps_avx512vl(auVar53,auVar49,auVar60);
          auVar50 = vfmsub213ps_avx512vl(auVar51,auVar50,auVar43);
          auVar48 = vfmsub213ps_avx512vl(auVar52,auVar48,auVar55);
          auVar37 = vandps_avx512vl(auVar37,auVar44);
          auVar60 = vandps_avx512vl(auVar60,auVar44);
          uVar34 = vcmpps_avx512vl(auVar37,auVar60,1);
          auVar37 = vandps_avx512vl(auVar41,auVar44);
          auVar41 = vandps_avx512vl(auVar43,auVar44);
          uVar13 = vcmpps_avx512vl(auVar37,auVar41,1);
          auVar37 = vandps_avx512vl(auVar59,auVar44);
          auVar41 = vandps_avx512vl(auVar55,auVar44);
          auVar59 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
          auVar103 = ZEXT1664(auVar59);
          uVar14 = vcmpps_avx512vl(auVar37,auVar41,1);
          bVar33 = (bool)((byte)uVar34 & 1);
          auVar63._0_4_ = (uint)bVar33 * auVar46._0_4_ | (uint)!bVar33 * auVar49._0_4_;
          bVar33 = (bool)((byte)(uVar34 >> 1) & 1);
          auVar63._4_4_ = (uint)bVar33 * auVar46._4_4_ | (uint)!bVar33 * auVar49._4_4_;
          bVar33 = (bool)((byte)(uVar34 >> 2) & 1);
          auVar63._8_4_ = (uint)bVar33 * auVar46._8_4_ | (uint)!bVar33 * auVar49._8_4_;
          bVar33 = (bool)((byte)(uVar34 >> 3) & 1);
          auVar63._12_4_ = (uint)bVar33 * auVar46._12_4_ | (uint)!bVar33 * auVar49._12_4_;
          bVar33 = (bool)((byte)uVar13 & 1);
          auVar64._0_4_ = (uint)bVar33 * auVar47._0_4_ | (uint)!bVar33 * auVar50._0_4_;
          bVar33 = (bool)((byte)(uVar13 >> 1) & 1);
          auVar64._4_4_ = (uint)bVar33 * auVar47._4_4_ | (uint)!bVar33 * auVar50._4_4_;
          bVar33 = (bool)((byte)(uVar13 >> 2) & 1);
          auVar64._8_4_ = (uint)bVar33 * auVar47._8_4_ | (uint)!bVar33 * auVar50._8_4_;
          bVar33 = (bool)((byte)(uVar13 >> 3) & 1);
          auVar64._12_4_ = (uint)bVar33 * auVar47._12_4_ | (uint)!bVar33 * auVar50._12_4_;
          bVar33 = (bool)((byte)uVar14 & 1);
          auVar65._0_4_ = (float)((uint)bVar33 * auVar45._0_4_ | (uint)!bVar33 * auVar48._0_4_);
          bVar33 = (bool)((byte)(uVar14 >> 1) & 1);
          auVar65._4_4_ = (float)((uint)bVar33 * auVar45._4_4_ | (uint)!bVar33 * auVar48._4_4_);
          bVar33 = (bool)((byte)(uVar14 >> 2) & 1);
          auVar65._8_4_ = (float)((uint)bVar33 * auVar45._8_4_ | (uint)!bVar33 * auVar48._8_4_);
          bVar33 = (bool)((byte)(uVar14 >> 3) & 1);
          auVar65._12_4_ = (float)((uint)bVar33 * auVar45._12_4_ | (uint)!bVar33 * auVar48._12_4_);
          auVar94._0_4_ = fVar93 * auVar65._0_4_;
          auVar94._4_4_ = fVar96 * auVar65._4_4_;
          auVar94._8_4_ = fVar97 * auVar65._8_4_;
          auVar94._12_4_ = fVar98 * auVar65._12_4_;
          auVar37 = vfmadd213ps_fma(auVar40,auVar64,auVar94);
          auVar37 = vfmadd213ps_fma(auVar39,auVar63,auVar37);
          auVar90._0_4_ = auVar37._0_4_ + auVar37._0_4_;
          auVar90._4_4_ = auVar37._4_4_ + auVar37._4_4_;
          auVar90._8_4_ = auVar37._8_4_ + auVar37._8_4_;
          auVar90._12_4_ = auVar37._12_4_ + auVar37._12_4_;
          auVar91._0_4_ = auVar77._0_4_ * auVar65._0_4_;
          auVar91._4_4_ = auVar77._4_4_ * auVar65._4_4_;
          auVar91._8_4_ = auVar77._8_4_ * auVar65._8_4_;
          auVar91._12_4_ = auVar77._12_4_ * auVar65._12_4_;
          auVar37 = vfmadd213ps_fma(auVar75,auVar64,auVar91);
          auVar40 = vfmadd213ps_fma(auVar62,auVar63,auVar37);
          auVar37 = vrcp14ps_avx512vl(auVar90);
          auVar41 = vxorps_avx512vl(auVar90,auVar59);
          auVar62 = auVar107._0_16_;
          auVar39 = vfnmadd213ps_avx512vl(auVar37,auVar90,auVar62);
          auVar39 = vfmadd132ps_fma(auVar39,auVar37,auVar37);
          auVar37 = *(undefined1 (*) [16])(ray + 0x80);
          auVar45._0_4_ = auVar39._0_4_ * (auVar40._0_4_ + auVar40._0_4_);
          auVar45._4_4_ = auVar39._4_4_ * (auVar40._4_4_ + auVar40._4_4_);
          auVar45._8_4_ = auVar39._8_4_ * (auVar40._8_4_ + auVar40._8_4_);
          auVar45._12_4_ = auVar39._12_4_ * (auVar40._12_4_ + auVar40._12_4_);
          uVar11 = vcmpps_avx512vl(auVar45,auVar37,2);
          uVar12 = vcmpps_avx512vl(auVar45,*(undefined1 (*) [16])(ray + 0x30),0xd);
          uVar16 = vcmpps_avx512vl(auVar90,auVar41,4);
          bVar23 = bVar23 & (byte)uVar11 & (byte)uVar12 & (byte)uVar16;
          auVar39 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
          auVar104 = ZEXT1664(auVar39);
          if (bVar23 != 0) {
            pGVar6 = (context->scene->geometries).items[*(uint *)(lVar26 + uVar32 * 4)].ptr;
            uVar3 = pGVar6->mask;
            auVar88._4_4_ = uVar3;
            auVar88._0_4_ = uVar3;
            auVar88._8_4_ = uVar3;
            auVar88._12_4_ = uVar3;
            uVar11 = vptestmd_avx512vl(auVar88,*(undefined1 (*) [16])(ray + 0x90));
            bVar23 = bVar23 & (byte)uVar11 & 0xf;
            uVar34 = (ulong)bVar23;
            if (bVar23 != 0) {
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                uVar13 = vcmpps_avx512vl(auVar38,auVar106._0_16_,5);
                auVar38 = vrcp14ps_avx512vl(auVar42);
                auVar42 = vfnmadd213ps_avx512vl(auVar42,auVar38,auVar62);
                auVar42 = vfmadd132ps_avx512vl(auVar42,auVar38,auVar38);
                fVar93 = (float)((uint)((byte)uVar13 & 1) * auVar42._0_4_);
                fVar96 = (float)((uint)((byte)(uVar13 >> 1) & 1) * auVar42._4_4_);
                fVar97 = (float)((uint)((byte)(uVar13 >> 2) & 1) * auVar42._8_4_);
                fVar98 = (float)((uint)((byte)(uVar13 >> 3) & 1) * auVar42._12_4_);
                auVar83._0_4_ = fVar93 * auVar54._0_4_;
                auVar83._4_4_ = fVar96 * auVar54._4_4_;
                auVar83._8_4_ = fVar97 * auVar54._8_4_;
                auVar83._12_4_ = fVar98 * auVar54._12_4_;
                auVar42 = vminps_avx512vl(auVar83,auVar62);
                auVar86._0_4_ = fVar93 * auVar56._0_4_;
                auVar86._4_4_ = fVar96 * auVar56._4_4_;
                auVar86._8_4_ = fVar97 * auVar56._8_4_;
                auVar86._12_4_ = fVar98 * auVar56._12_4_;
                auVar38 = vminps_avx512vl(auVar86,auVar62);
                local_1898 = vsubps_avx512vl(auVar62,auVar42);
                local_1888 = vsubps_avx512vl(auVar62,auVar38);
                local_1868 = vpbroadcastd_avx512vl();
                local_1878 = vpbroadcastd_avx512vl();
                local_18c8[0] = (RTCHitN)(char)auVar63._0_4_;
                local_18c8[1] = (RTCHitN)(char)(auVar63._0_4_ >> 8);
                local_18c8[2] = (RTCHitN)(char)(auVar63._0_4_ >> 0x10);
                local_18c8[3] = (RTCHitN)(char)(auVar63._0_4_ >> 0x18);
                local_18c8[4] = (RTCHitN)(char)auVar63._4_4_;
                local_18c8[5] = (RTCHitN)(char)(auVar63._4_4_ >> 8);
                local_18c8[6] = (RTCHitN)(char)(auVar63._4_4_ >> 0x10);
                local_18c8[7] = (RTCHitN)(char)(auVar63._4_4_ >> 0x18);
                local_18c8[8] = (RTCHitN)(char)auVar63._8_4_;
                local_18c8[9] = (RTCHitN)(char)(auVar63._8_4_ >> 8);
                local_18c8[10] = (RTCHitN)(char)(auVar63._8_4_ >> 0x10);
                local_18c8[0xb] = (RTCHitN)(char)(auVar63._8_4_ >> 0x18);
                local_18c8[0xc] = (RTCHitN)(char)auVar63._12_4_;
                local_18c8[0xd] = (RTCHitN)(char)(auVar63._12_4_ >> 8);
                local_18c8[0xe] = (RTCHitN)(char)(auVar63._12_4_ >> 0x10);
                local_18c8[0xf] = (RTCHitN)(char)(auVar63._12_4_ >> 0x18);
                local_18b8 = auVar64;
                local_18a8 = auVar65;
                vpcmpeqd_avx2(ZEXT1632(auVar64),ZEXT1632(auVar64));
                uStack_1854 = context->user->instID[0];
                local_1858 = uStack_1854;
                uStack_1850 = uStack_1854;
                uStack_184c = uStack_1854;
                uStack_1848 = context->user->instPrimID[0];
                uStack_1844 = uStack_1848;
                uStack_1840 = uStack_1848;
                uStack_183c = uStack_1848;
                auVar42 = vblendmps_avx512vl(auVar37,auVar45);
                bVar33 = (bool)(bVar23 >> 1 & 1);
                bVar8 = (bool)(bVar23 >> 2 & 1);
                *(uint *)(ray + 0x80) =
                     (uint)(bVar23 & 1) * auVar42._0_4_ | !(bool)(bVar23 & 1) * uStack_1848;
                *(uint *)(ray + 0x84) = (uint)bVar33 * auVar42._4_4_ | !bVar33 * uStack_1848;
                *(uint *)(ray + 0x88) = (uint)bVar8 * auVar42._8_4_ | !bVar8 * uStack_1848;
                *(uint *)(ray + 0x8c) =
                     (uint)(bVar23 >> 3) * auVar42._12_4_ | !(bool)(bVar23 >> 3) * uStack_1848;
                local_1958 = vpmovm2d_avx512vl(uVar34);
                args.valid = (int *)local_1958;
                args.geometryUserPtr = pGVar6->userPtr;
                args.context = context->user;
                args.hit = local_18c8;
                args.N = 4;
                args.ray = (RTCRayN *)ray;
                if (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  local_1948 = ray;
                  (*pGVar6->occlusionFilterN)(&args);
                  auVar42 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                  auVar103 = ZEXT1664(auVar42);
                  auVar42 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                  auVar104 = ZEXT1664(auVar42);
                  auVar42 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                  auVar110 = ZEXT1664(auVar42);
                  auVar42 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                  auVar109 = ZEXT1664(auVar42);
                  auVar42 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                  auVar108 = ZEXT1664(auVar42);
                  auVar42 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                  auVar107 = ZEXT1664(auVar42);
                  auVar42 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
                  auVar106 = ZEXT1664(auVar42);
                  auVar42 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                  auVar105 = ZEXT1664(auVar42);
                  ray = local_1948;
                }
                uVar34 = vptestmd_avx512vl(local_1958,local_1958);
                uVar34 = uVar34 & 0xf;
                if ((char)uVar34 != '\0') {
                  p_Var7 = context->args->filter;
                  if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar6->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    (*p_Var7)(&args);
                    auVar42 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                    auVar103 = ZEXT1664(auVar42);
                    auVar42 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                    auVar104 = ZEXT1664(auVar42);
                    auVar42 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                    auVar110 = ZEXT1664(auVar42);
                    auVar42 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                    auVar109 = ZEXT1664(auVar42);
                    auVar42 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                    auVar108 = ZEXT1664(auVar42);
                    auVar42 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                    auVar107 = ZEXT1664(auVar42);
                    auVar42 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
                    auVar106 = ZEXT1664(auVar42);
                    auVar42 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                    auVar105 = ZEXT1664(auVar42);
                  }
                  uVar34 = vptestmd_avx512vl(local_1958,local_1958);
                  uVar34 = uVar34 & 0xf;
                  auVar42 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                  bVar33 = (bool)((byte)uVar34 & 1);
                  auVar66._0_4_ =
                       (uint)bVar33 * auVar42._0_4_ | (uint)!bVar33 * *(int *)(args.ray + 0x80);
                  bVar33 = (bool)((byte)(uVar34 >> 1) & 1);
                  auVar66._4_4_ =
                       (uint)bVar33 * auVar42._4_4_ | (uint)!bVar33 * *(int *)(args.ray + 0x84);
                  bVar33 = (bool)((byte)(uVar34 >> 2) & 1);
                  auVar66._8_4_ =
                       (uint)bVar33 * auVar42._8_4_ | (uint)!bVar33 * *(int *)(args.ray + 0x88);
                  bVar33 = SUB81(uVar34 >> 3,0);
                  auVar66._12_4_ =
                       (uint)bVar33 * auVar42._12_4_ | (uint)!bVar33 * *(int *)(args.ray + 0x8c);
                  *(undefined1 (*) [16])(args.ray + 0x80) = auVar66;
                }
                bVar33 = (bool)((byte)uVar34 & 1);
                auVar67._0_4_ = (uint)bVar33 * *(int *)local_1940 | (uint)!bVar33 * auVar37._0_4_;
                bVar33 = (bool)((byte)(uVar34 >> 1) & 1);
                auVar67._4_4_ =
                     (uint)bVar33 * *(int *)(local_1940 + 4) | (uint)!bVar33 * auVar37._4_4_;
                bVar33 = (bool)((byte)(uVar34 >> 2) & 1);
                auVar67._8_4_ =
                     (uint)bVar33 * *(int *)(local_1940 + 8) | (uint)!bVar33 * auVar37._8_4_;
                bVar33 = SUB81(uVar34 >> 3,0);
                auVar67._12_4_ =
                     (uint)bVar33 * *(int *)(local_1940 + 0xc) | (uint)!bVar33 * auVar37._12_4_;
                *(undefined1 (*) [16])local_1940 = auVar67;
              }
              bVar24 = ((byte)uVar34 ^ 0xf) & bVar24;
            }
          }
        }
        bVar33 = bVar24 != 0;
      }
      if ((!bVar33) || (bVar33 = 2 < uVar32, uVar32 = uVar32 + 1, bVar33)) break;
    }
    bVar21 = bVar21 & bVar24;
    if (bVar21 == 0) break;
  }
  bVar21 = bVar21 ^ 0xf;
LAB_0073e9aa:
  bVar31 = bVar31 | bVar21;
  uVar25 = local_1938;
  if (bVar31 == 0xf) {
LAB_0073e9b3:
    iVar22 = 3;
  }
  else {
    auVar37 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
    tray.tfar.field_0.i[0] =
         (uint)(bVar31 & 1) * auVar37._0_4_ | (uint)!(bool)(bVar31 & 1) * tray.tfar.field_0.i[0];
    bVar33 = (bool)(bVar31 >> 1 & 1);
    tray.tfar.field_0.i[1] = (uint)bVar33 * auVar37._4_4_ | (uint)!bVar33 * tray.tfar.field_0.i[1];
    bVar33 = (bool)(bVar31 >> 2 & 1);
    tray.tfar.field_0.i[2] = (uint)bVar33 * auVar37._8_4_ | (uint)!bVar33 * tray.tfar.field_0.i[2];
    bVar33 = (bool)(bVar31 >> 3 & 1);
    tray.tfar.field_0.i[3] = (uint)bVar33 * auVar37._12_4_ | (uint)!bVar33 * tray.tfar.field_0.i[3];
    iVar22 = 0;
  }
LAB_0073e9db:
  if (iVar22 == 3) {
    bVar31 = bVar31 & bVar35;
    bVar33 = (bool)(bVar31 >> 1 & 1);
    bVar8 = (bool)(bVar31 >> 2 & 1);
    *(uint *)local_1940 =
         (uint)(bVar31 & 1) * auVar108._0_4_ | (uint)!(bool)(bVar31 & 1) * *(int *)local_1940;
    *(uint *)(local_1940 + 4) =
         (uint)bVar33 * auVar108._4_4_ | (uint)!bVar33 * *(int *)(local_1940 + 4);
    *(uint *)(local_1940 + 8) =
         (uint)bVar8 * auVar108._8_4_ | (uint)!bVar8 * *(int *)(local_1940 + 8);
    *(uint *)(local_1940 + 0xc) =
         (uint)(bVar31 >> 3) * auVar108._12_4_ |
         (uint)!(bool)(bVar31 >> 3) * *(int *)(local_1940 + 0xc);
    return;
  }
  goto LAB_0073da0b;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }